

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  vec4 *c1;
  pointer pVVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int x;
  long lVar9;
  ComputeShaderBase *pCVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  Vector<float,_3> local_7c;
  ulong local_70;
  vec4 *local_68;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  vec4 *epsilon;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,(long)(height * width),(allocator_type *)&local_7c);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1907
             ,0x1406,fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pVVar1 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  fVar13 = (float)width * 0.1 + 1.0;
  fVar12 = (float)height * 0.1 + 1.0;
  iVar8 = (int)fVar12;
  uVar7 = (uint)(((float)width - (fVar13 + fVar13)) + -1.0);
  epsilon = (vec4 *)(ulong)uVar7;
  local_68 = &this->g_color_eps;
  iVar6 = iVar8 * width + (int)fVar13;
  local_70 = (ulong)(uint)width;
  do {
    lVar9 = (long)(int)fVar13;
    iVar11 = iVar6;
    if ((int)(((float)height - (fVar12 + fVar12)) + -1.0) <= iVar8) {
      iVar6 = (int)local_70;
      tcu::Vector<float,_3>::Vector(&local_7c,0.0);
      c1 = local_68;
      bVar2 = ColorEqual((ComputeShaderBase *)(pVVar1 + (iVar6 * 2 + 2)),&local_7c,(vec3 *)local_68,
                         epsilon);
      pCVar10 = (ComputeShaderBase *)
                (fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (iVar6 * 3 + -3));
      tcu::Vector<float,_3>::Vector(&local_7c,0.0);
      bVar3 = ColorEqual(pCVar10,&local_7c,(vec3 *)c1,epsilon);
      iVar8 = (height + -3) * iVar6;
      pCVar10 = (ComputeShaderBase *)
                (fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (iVar8 + iVar6 + -3));
      tcu::Vector<float,_3>::Vector(&local_7c,0.0);
      bVar4 = ColorEqual(pCVar10,&local_7c,(vec3 *)c1,epsilon);
      tcu::Vector<float,_3>::Vector(&local_7c,0.0);
      bVar5 = ColorEqual((ComputeShaderBase *)
                         (fb.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (iVar8 + 2)),&local_7c,
                         (vec3 *)c1,epsilon);
      bVar5 = bVar5 && (bVar4 && (bVar3 && bVar2));
LAB_009caa8a:
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base(&fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   );
      return bVar5;
    }
    while (lVar9 < (int)uVar7) {
      bVar2 = ColorEqual((ComputeShaderBase *)(pVVar1 + iVar11),expected,(vec3 *)local_68,epsilon);
      lVar9 = lVar9 + 1;
      iVar11 = iVar11 + 1;
      if (!bVar2) {
        bVar5 = false;
        goto LAB_009caa8a;
      }
    }
    iVar8 = iVar8 + 1;
    iVar6 = iVar6 + (int)local_70;
  } while( true );
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool			  result = true;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		int startx = int(((float)width * 0.1f) + 1);
		int starty = int(((float)height * 0.1f) + 1);
		int endx   = int((float)width - 2 * (((float)width * 0.1f) + 1) - 1);
		int endy   = int((float)height - 2 * (((float)height * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}